

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::CalcAbsBoneMatrices_3DGS_MDL7(MDLImporter *this,IntBone_MDL7 **apcOutBones)

{
  float fVar1;
  uchar *puVar2;
  IntBone_MDL7 *pIVar3;
  IntBone_MDL7 *pIVar4;
  uint uVar5;
  ai_uint32 aVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  bool bVar12;
  
  if (apcOutBones == (IntBone_MDL7 **)0x0) {
    __assert_fail("__null != apcOutBones",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x37a,
                  "void Assimp::MDLImporter::CalcAbsBoneMatrices_3DGS_MDL7(MDL::IntBone_MDL7 **)");
  }
  puVar2 = this->mBuffer;
  if (*(int *)(puVar2 + 8) != 0) {
    uVar10 = 0xffff;
    uVar5 = 1;
    do {
      if (*(int *)(puVar2 + 8) != 0) {
        uVar11 = 0;
        do {
          uVar7 = (ulong)((uint)*(ushort *)(puVar2 + 0x1c) * (int)uVar11);
          if (uVar10 == *(ushort *)(puVar2 + uVar7 + 0x30)) {
            pIVar3 = apcOutBones[uVar11];
            pIVar3->iParent = (ulong)*(ushort *)(puVar2 + uVar7 + 0x30);
            if (uVar10 != 0xffff) {
              pIVar4 = apcOutBones[uVar10];
              (pIVar3->super_aiBone).mOffsetMatrix.a4 = -(pIVar4->vPosition).x;
              (pIVar3->super_aiBone).mOffsetMatrix.b4 = -(pIVar4->vPosition).y;
              (pIVar3->super_aiBone).mOffsetMatrix.c4 = -(pIVar4->vPosition).z;
            }
            (pIVar3->vPosition).x = *(float *)(puVar2 + uVar7 + 0x34);
            (pIVar3->vPosition).y = *(float *)(puVar2 + uVar7 + 0x38);
            (pIVar3->vPosition).z = *(float *)(puVar2 + uVar7 + 0x3c);
            fVar1 = (pIVar3->super_aiBone).mOffsetMatrix.b4;
            (pIVar3->super_aiBone).mOffsetMatrix.a4 =
                 (pIVar3->super_aiBone).mOffsetMatrix.a4 - *(float *)(puVar2 + uVar7 + 0x34);
            (pIVar3->super_aiBone).mOffsetMatrix.b4 = fVar1 - *(float *)(puVar2 + uVar7 + 0x38);
            (pIVar3->super_aiBone).mOffsetMatrix.c4 =
                 (pIVar3->super_aiBone).mOffsetMatrix.c4 - *(float *)(puVar2 + uVar7 + 0x3c);
            if (*(ushort *)(puVar2 + 0x1c) == 0x10) {
              aVar6 = snprintf((pIVar3->super_aiBone).mName.data,0x400,"UnnamedBone_%i",
                               uVar11 & 0xffffffff);
              (pIVar3->super_aiBone).mName.length = aVar6;
            }
            else {
              uVar8 = *(ushort *)(puVar2 + 0x1c) - 0x10;
              if (uVar8 != 0) {
                uVar9 = 0;
                do {
                  if (puVar2[uVar9 + uVar7 + 0x40] == '\0') {
                    uVar8 = (uint)uVar9;
                    break;
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar8 != uVar9);
              }
              (pIVar3->super_aiBone).mName.length = uVar8;
              memcpy((pIVar3->super_aiBone).mName.data,puVar2 + uVar7 + 0x40,(ulong)uVar8);
              (pIVar3->super_aiBone).mName.data[uVar8] = '\0';
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < *(uint *)(puVar2 + 8));
      }
      uVar10 = uVar10 + 1;
      bVar12 = uVar5 < *(uint *)(puVar2 + 8);
      uVar5 = uVar5 + 1;
    } while (bVar12);
  }
  return;
}

Assistant:

void MDLImporter::CalcAbsBoneMatrices_3DGS_MDL7(MDL::IntBone_MDL7** apcOutBones)
{
    const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    const MDL::Bone_MDL7* pcBones = (const MDL::Bone_MDL7*)(pcHeader+1);
    ai_assert(NULL != apcOutBones);

    // first find the bone that has NO parent, calculate the
    // animation matrix for it, then go on and search for the next parent
    // index (0) and so on until we can't find a new node.
    uint16_t iParent = 0xffff;
    uint32_t iIterations = 0;
    while (iIterations++ < pcHeader->bones_num) {
        for (uint32_t iBone = 0; iBone < pcHeader->bones_num;++iBone)   {
            BE_NCONST MDL::Bone_MDL7* pcBone = _AI_MDL7_ACCESS_PTR(pcBones,iBone,
                pcHeader->bone_stc_size,MDL::Bone_MDL7);

            AI_SWAP2(pcBone->parent_index);
            AI_SWAP4(pcBone->x);
            AI_SWAP4(pcBone->y);
            AI_SWAP4(pcBone->z);

            if (iParent == pcBone->parent_index)    {
                // MDL7 readme
                ////////////////////////////////////////////////////////////////
                /*
                The animation matrix is then calculated the following way:

                vector3 bPos = <absolute bone position>
                matrix44 laM;   // local animation matrix
                sphrvector key_rotate = <bone rotation>

                matrix44 m1,m2;
                create_trans_matrix(m1, -bPos.x, -bPos.y, -bPos.z);
                create_trans_matrix(m2, -bPos.x, -bPos.y, -bPos.z);

                create_rotation_matrix(laM,key_rotate);

                laM = sm1 * laM;
                laM = laM * sm2;
                */
                /////////////////////////////////////////////////////////////////

                MDL::IntBone_MDL7* const pcOutBone = apcOutBones[iBone];

                // store the parent index of the bone
                pcOutBone->iParent = pcBone->parent_index;
                if (0xffff != iParent)  {
                    const MDL::IntBone_MDL7* pcParentBone = apcOutBones[iParent];
                    pcOutBone->mOffsetMatrix.a4 = -pcParentBone->vPosition.x;
                    pcOutBone->mOffsetMatrix.b4 = -pcParentBone->vPosition.y;
                    pcOutBone->mOffsetMatrix.c4 = -pcParentBone->vPosition.z;
                }
                pcOutBone->vPosition.x = pcBone->x;
                pcOutBone->vPosition.y = pcBone->y;
                pcOutBone->vPosition.z = pcBone->z;
                pcOutBone->mOffsetMatrix.a4 -= pcBone->x;
                pcOutBone->mOffsetMatrix.b4 -= pcBone->y;
                pcOutBone->mOffsetMatrix.c4 -= pcBone->z;

                if (AI_MDL7_BONE_STRUCT_SIZE__NAME_IS_NOT_THERE == pcHeader->bone_stc_size) {
                    // no real name for our poor bone is specified :-(
                    pcOutBone->mName.length = ai_snprintf(pcOutBone->mName.data, MAXLEN,
                        "UnnamedBone_%i",iBone);
                }
                else    {
                    // Make sure we won't run over the buffer's end if there is no
                    // terminal 0 character (however the documentation says there
                    // should be one)
                    uint32_t iMaxLen = pcHeader->bone_stc_size-16;
                    for (uint32_t qq = 0; qq < iMaxLen;++qq)    {
                        if (!pcBone->name[qq])  {
                            iMaxLen = qq;
                            break;
                        }
                    }

                    // store the name of the bone
                    pcOutBone->mName.length = (size_t)iMaxLen;
                    ::memcpy(pcOutBone->mName.data,pcBone->name,pcOutBone->mName.length);
                    pcOutBone->mName.data[pcOutBone->mName.length] = '\0';
                }
            }
        }
        ++iParent;
    }
}